

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw.h
# Opt level: O2

void VW::init_features(primitive_feature_space *fs,size_t features_count)

{
  feature *pfVar1;
  feature *pfVar2;
  
  pfVar1 = (feature *)operator_new__(-(ulong)(features_count >> 0x3c != 0) | features_count * 0x10);
  if (features_count != 0) {
    pfVar2 = pfVar1;
    do {
      pfVar2->x = 0.0;
      pfVar2->weight_index = 0;
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 != pfVar1 + features_count);
  }
  fs->fs = pfVar1;
  fs->len = features_count;
  return;
}

Assistant:

inline void init_features(primitive_feature_space& fs, size_t features_count) {
  fs.fs = new feature[features_count];
  fs.len = features_count;
}